

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayGetterCalls.cpp
# Opt level: O2

void __thiscall glcts::TextureCubeMapArrayGetterCalls::deinit(TextureCubeMapArrayGetterCalls *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0xb8))(0x9009,0);
  if (this->m_to_id != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x480))(1,&this->m_to_id);
    this->m_to_id = 0;
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void TextureCubeMapArrayGetterCalls::deinit(void)
{
	/* Retrieve ES entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset ES state */
	gl.bindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, 0);

	/* Release any objects that may have been created during test execution */
	if (m_to_id != 0)
	{
		gl.deleteTextures(1, &m_to_id);

		m_to_id = 0;
	}

	/* Deinitialize base class */
	TestCaseBase::deinit();
}